

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_list_to_vector_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp psVar1;
  sexp *ppsVar2;
  sexp_sint_t n_00;
  
  psVar1 = sexp_length_op(ctx,self,n,ls);
  psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,n_00,psVar1,(sexp)&DAT_0000043e);
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    ppsVar2 = &(psVar1->value).type.cpl;
    for (; (((ulong)ls & 3) == 0 && (ls->tag == 6)); ls = (ls->value).type.cpl) {
      *ppsVar2 = (sexp)(ls->value).flonum;
      ppsVar2 = ppsVar2 + 1;
    }
  }
  return psVar1;
}

Assistant:

sexp sexp_list_to_vector_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  int i;
  sexp x, *elts, vec = sexp_make_vector(ctx, sexp_length(ctx, ls), SEXP_VOID);
  if (sexp_exceptionp(vec)) return vec;
  elts = sexp_vector_data(vec);
  for (i=0, x=ls; sexp_pairp(x); i++, x=sexp_cdr(x))
    elts[i] = sexp_car(x);
  return vec;
}